

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyEasy.cpp
# Opt level: O3

void __thiscall
chrono::ChBodyEasyConvexHullAuxRef::SetupBody
          (ChBodyEasyConvexHullAuxRef *this,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *points,
          double density,bool visualize,bool collide,shared_ptr<chrono::ChMaterialSurface> *material
          )

{
  double *pdVar1;
  ChTriangleMeshConnected *pCVar2;
  pointer pCVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  bool bVar6;
  uint uVar7;
  SrcEvaluatorType srcEvaluator;
  ChTriangleMeshShape *pCVar8;
  long *plVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  EigenvectorsType *pEVar11;
  element_type *peVar12;
  uint uVar13;
  undefined7 in_register_00000009;
  double dVar14;
  double *pdVar15;
  ulong uVar16;
  uint __val;
  uint __len;
  ulong uVar17;
  uint uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  ChConvexHullLibraryWrapper lh;
  shared_ptr<chrono::ChTriangleMeshShape> vshape;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> points_reduced;
  double mass;
  ChMatrix33<double> principal_inertia_csys;
  ChVector<double> baricenter;
  ChMatrix33<double> inertia;
  ChVector<double> v;
  ChConvexHullLibraryWrapper local_229;
  ChTriangleMeshShape *local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_220 [2];
  shared_ptr<chrono::ChMaterialSurface> *local_210;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> local_208;
  shared_ptr<chrono::ChVisualModel> local_1e8;
  double local_1d8;
  double dStack_1d0;
  element_type *local_1c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1c0;
  shared_ptr<chrono::ChVisualShape> local_1b8;
  double local_1a0;
  double local_198;
  ChMatrix33<double> local_180;
  ChVector<double> local_138;
  ChMatrix33<double> local_120;
  SelfAdjointEigenSolver<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_d8;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  dVar14 = (double)CONCAT71(in_register_00000009,collide);
  local_198 = density;
  pCVar8 = (ChTriangleMeshShape *)ChVisualShape::operator_new((ChVisualShape *)0x98,(size_t)points);
  ChTriangleMeshShape::ChTriangleMeshShape(pCVar8);
  local_228 = pCVar8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChTriangleMeshShape*>
            (a_Stack_220,pCVar8);
  collision::bt_utils::ChConvexHullLibraryWrapper::ChConvexHullLibraryWrapper(&local_229);
  pCVar2 = (local_228->trimesh).
           super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var10 = (local_228->trimesh).
            super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
    }
  }
  collision::bt_utils::ChConvexHullLibraryWrapper::ComputeHull(&local_229,points,pCVar2);
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
  }
  pCVar8 = local_228;
  if (visualize) {
    uVar18 = (this->super_ChBodyAuxRef).super_ChBody.super_ChPhysicsItem.super_ChObj.m_identifier;
    local_1d8 = (double)CONCAT44(local_1d8._4_4_,SUB84(dVar14,0));
    __len = 1;
    __val = -uVar18;
    if (0 < (int)uVar18) {
      __val = uVar18;
    }
    if (9 < __val) {
      uVar16 = (ulong)__val;
      uVar7 = 4;
      do {
        __len = uVar7;
        uVar13 = (uint)uVar16;
        if (uVar13 < 100) {
          __len = __len - 2;
          goto LAB_005157d2;
        }
        if (uVar13 < 1000) {
          __len = __len - 1;
          goto LAB_005157d2;
        }
        if (uVar13 < 10000) goto LAB_005157d2;
        uVar16 = uVar16 / 10000;
        uVar7 = __len + 4;
      } while (99999 < uVar13);
      __len = __len + 1;
    }
LAB_005157d2:
    local_120.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)(local_120.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array + 2);
    local_210 = material;
    std::__cxx11::string::_M_construct((ulong)&local_120,(char)__len - (char)((int)uVar18 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_120.super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array[0] + (ulong)(uVar18 >> 0x1f)),__len,__val);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,0x957171);
    dVar14 = local_1d8;
    material = local_210;
    pdVar1 = local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array + 2;
    pdVar15 = (double *)(plVar9 + 2);
    if ((double *)*plVar9 == pdVar15) {
      local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[2] = *pdVar15;
      local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[3] = (double)plVar9[3];
      local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[0] = (double)pdVar1;
    }
    else {
      local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[2] = *pdVar15;
      local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[0] = (double)*plVar9;
    }
    local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[1] = (double)plVar9[1];
    *plVar9 = (long)pdVar15;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::string::_M_assign((string *)&pCVar8->name);
    if ((double *)
        local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] != pdVar1) {
      operator_delete((void *)local_d8.m_eivec.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array[0],
                      (long)local_d8.m_eivec.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                            m_data.array[2] + 1);
    }
    if ((double *)
        local_120.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] !=
        local_120.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 2) {
      operator_delete((void *)local_120.super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array[0],
                      (long)local_120.super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array[2] + 1);
    }
    p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x40);
    p_Var10->_M_use_count = 1;
    p_Var10->_M_weak_count = 1;
    p_Var10->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b0bf68;
    p_Var10[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var10[1]._M_use_count = 0;
    p_Var10[1]._M_weak_count = 0;
    p_Var10[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var10[2]._M_use_count = 0;
    p_Var10[2]._M_weak_count = 0;
    p_Var10[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var10[2]._M_use_count = 0;
    p_Var10[2]._M_weak_count = 0;
    p_Var10[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var10[3]._M_use_count = 0;
    p_Var10[3]._M_weak_count = 0;
    local_1b8.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_228->super_ChVisualShape;
    local_1b8.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = a_Stack_220[0]._M_pi;
    if (a_Stack_220[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (a_Stack_220[0]._M_pi)->_M_use_count = (a_Stack_220[0]._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (a_Stack_220[0]._M_pi)->_M_use_count = (a_Stack_220[0]._M_pi)->_M_use_count + 1;
      }
    }
    local_120.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
    local_120.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    local_120.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
    local_120.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
    local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[0] = (double)&PTR__ChFrame_00b03780;
    local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[1] = 0.0;
    local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[2] = 0.0;
    local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[3] = 0.0;
    local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[4] = 1.0;
    local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[5] = 0.0;
    local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[6] = 0.0;
    local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[7] = 0.0;
    ChMatrix33<double>::ChMatrix33
              ((ChMatrix33<double> *)
               (local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                m_storage.m_data.array + 8),(ChQuaternion<double> *)&local_120);
    ChVisualModel::AddShape((ChVisualModel *)(p_Var10 + 1),&local_1b8,(ChFrame<double> *)&local_d8);
    if (local_1b8.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1b8.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
    }
    local_1e8.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (ChVisualModel *)(p_Var10 + 1);
    local_1e8.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var10;
    ChPhysicsItem::AddVisualModel((ChPhysicsItem *)this,&local_1e8);
    if (local_1e8.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1e8.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
  }
  local_138.m_data[2] = 0.0;
  local_138.m_data[0] = 0.0;
  local_138.m_data[1] = 0.0;
  pCVar2 = (local_228->trimesh).
           super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var10 = (local_228->trimesh).
            super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
    }
  }
  geometry::ChTriangleMeshConnected::ComputeMassProperties
            (pCVar2,true,&local_1a0,&local_138,&local_120);
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
  }
  local_d8.m_isInitialized = false;
  local_d8.m_eigenvectorsOk = false;
  Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double,3,3,1,3,3>>::
  compute<Eigen::Matrix<double,3,3,1,3,3>>
            ((SelfAdjointEigenSolver<Eigen::Matrix<double,3,3,1,3,3>> *)&local_d8,
             (EigenBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_120,0x80);
  if (local_d8.m_isInitialized == false) {
    __assert_fail("m_isInitialized && \"SelfAdjointEigenSolver is not initialized.\"",
                  "/usr/include/eigen3/Eigen/src/Eigenvalues/SelfAdjointEigenSolver.h",0x12e,
                  "const RealVectorType &Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double, 3, 3, 1>>::eigenvalues() const [_MatrixType = Eigen::Matrix<double, 3, 3, 1>]"
                 );
  }
  local_1d8 = local_d8.m_eivalues.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[0];
  dStack_1d0 = local_d8.m_eivalues.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[1];
  local_210 = (shared_ptr<chrono::ChMaterialSurface> *)
              local_d8.m_eivalues.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[2];
  pEVar11 = Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::eigenvectors
                      (&local_d8);
  local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (pEVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
       array[0];
  local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (pEVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
       array[3];
  local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (pEVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
       array[6];
  local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       (pEVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
       array[1];
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       (pEVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
       array[4];
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       (pEVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
       array[7];
  local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       (pEVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
       array[2];
  local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       (pEVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
       array[5];
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       (pEVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
       array[8];
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] *
       local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar23 = vfmsub231sd_fma(auVar28,auVar23,auVar27);
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] *
       local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar25 = vfmsub231sd_fma(auVar25,auVar20,auVar27);
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] *
       local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar20 = vfmsub231sd_fma(auVar24,auVar20,auVar26);
  if (local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] *
      auVar20._0_8_ +
      (auVar23._0_8_ *
       local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] -
      local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] *
      auVar25._0_8_) < 0.0) {
    auVar19._0_8_ =
         -local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar19._8_8_ = 0x8000000000000000;
    auVar22._0_8_ =
         -local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar22._8_8_ = 0x8000000000000000;
    auVar21._0_8_ =
         -local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar21._8_8_ = 0x8000000000000000;
    local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)vmovlpd_avx(auVar19);
    local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         (double)vmovlpd_avx(auVar22);
    local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         (double)vmovlpd_avx(auVar21);
  }
  (this->super_ChBodyAuxRef).super_ChBody.density = (float)local_198;
  ChVariablesBodyOwnMass::SetBodyMass
            (&(this->super_ChBodyAuxRef).super_ChBody.variables,local_198 * local_1a0);
  local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[0] = local_198 * local_1d8;
  local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[1] = local_198 * dStack_1d0;
  local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[2] = local_198 * (double)local_210;
  ChBody::SetInertiaXX((ChBody *)this,(ChVector<double> *)&local_d8);
  ChFrame<double>::ChFrame((ChFrame<double> *)&local_d8,&local_138,&local_180);
  ChBodyAuxRef::SetFrame_COG_to_REF(&this->super_ChBodyAuxRef,(ChFrame<double> *)&local_d8);
  if (SUB81(dVar14,0) != '\0') {
    if ((material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        == (element_type *)0x0) {
      __assert_fail("material",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChBodyEasy.cpp"
                    ,0x164,
                    "void chrono::ChBodyEasyConvexHullAuxRef::SetupBody(std::vector<ChVector<>> &, double, bool, bool, std::shared_ptr<ChMaterialSurface>)"
                   );
    }
    local_208.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_208.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_208.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    peVar12 = (local_228->trimesh).
              super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    p_Var10 = (local_228->trimesh).
              super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
      }
    }
    std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
              (&local_208,
               ((long)(peVar12->m_vertices).
                      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(peVar12->m_vertices).
                      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
    }
    uVar18 = 0;
    do {
      uVar16 = (ulong)uVar18;
      peVar12 = (local_228->trimesh).
                super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      p_Var10 = (local_228->trimesh).
                super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
      if (p_Var10 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        uVar17 = ((long)(peVar12->m_vertices).
                        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(peVar12->m_vertices).
                        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        if (uVar17 < uVar16 || uVar17 - uVar16 == 0) goto LAB_00515daa;
LAB_00515d51:
        bVar6 = true;
        p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
        }
        uVar17 = ((long)(peVar12->m_vertices).
                        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(peVar12->m_vertices).
                        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
        if (uVar17 < uVar16 || uVar17 - uVar16 == 0) goto LAB_00515daa;
        peVar12 = (local_228->trimesh).
                  super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        p_Var10 = (local_228->trimesh).
                  super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
        if (p_Var10 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00515d51;
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
        }
        bVar6 = false;
      }
      pCVar3 = (peVar12->m_vertices).
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pCVar3 != local_208.
                    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
        local_208.
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar16].m_data[0] = pCVar3[uVar16].m_data[0];
        local_208.
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar16].m_data[1] = pCVar3[uVar16].m_data[1];
        local_208.
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar16].m_data[2] = pCVar3[uVar16].m_data[2];
      }
      if (!bVar6) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
      }
      uVar18 = uVar18 + 1;
    } while( true );
  }
LAB_00515efb:
  peVar12 = (local_228->trimesh).
            super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  p_Var5 = (local_228->trimesh).
           super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  p_Var10 = (local_228->trimesh).
            super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
    }
  }
  p_Var10 = (this->m_mesh).
            super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (this->m_mesh).
  super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar12;
  (this->m_mesh).
  super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var5;
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
  }
  if (a_Stack_220[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_220[0]._M_pi);
  }
  return;
LAB_00515daa:
  peVar4 = (this->super_ChBodyAuxRef).super_ChBody.collision_model.
           super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var10 = (this->super_ChBodyAuxRef).super_ChBody.collision_model.
            super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
    }
  }
  (*peVar4->_vptr_ChCollisionModel[3])();
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
  }
  peVar4 = (this->super_ChBodyAuxRef).super_ChBody.collision_model.
           super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var10 = (this->super_ChBodyAuxRef).super_ChBody.collision_model.
            super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
    }
  }
  local_1c8 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
  p_Stack_1c0 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                )._M_refcount._M_pi;
  p_Var5 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
  }
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[5] = 0.0;
  local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[6] = 0.0;
  local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[7] = 0.0;
  local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[1] = 0.0;
  local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[2] = 0.0;
  local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[3] = 0.0;
  local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[0] = 1.0;
  local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[4] = 1.0;
  local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[8] = 1.0;
  (*peVar4->_vptr_ChCollisionModel[0xf])(peVar4,&local_1c8,&local_208);
  if (p_Stack_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1c0);
  }
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
  }
  peVar4 = (this->super_ChBodyAuxRef).super_ChBody.collision_model.
           super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var10 = (this->super_ChBodyAuxRef).super_ChBody.collision_model.
            super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
    }
  }
  (*peVar4->_vptr_ChCollisionModel[4])();
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
  }
  ChBody::SetCollide((ChBody *)this,true);
  if (local_208.
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.
                    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  goto LAB_00515efb;
}

Assistant:

void ChBodyEasyConvexHullAuxRef::SetupBody(std::vector<ChVector<>>& points,
                                           double density,
                                           bool visualize,
                                           bool collide,
                                           std::shared_ptr<ChMaterialSurface> material) {
    auto vshape = chrono_types::make_shared<ChTriangleMeshShape>();
    collision::bt_utils::ChConvexHullLibraryWrapper lh;
    lh.ComputeHull(points, *vshape->GetMesh());
    if (visualize) {
        vshape->SetName("chull_mesh_" + std::to_string(GetIdentifier()));
        auto vmodel = chrono_types::make_shared<ChVisualModel>();
        vmodel->AddShape(vshape);
        this->AddVisualModel(vmodel);
    }

    double mass;
    ChVector<> baricenter;
    ChMatrix33<> inertia;
    vshape->GetMesh()->ComputeMassProperties(true, mass, baricenter, inertia);

    ChMatrix33<> principal_inertia_csys;
    ChVectorN<double, 3> principal_I;
    inertia.SelfAdjointEigenSolve(principal_inertia_csys, principal_I);
    if (principal_inertia_csys.determinant() < 0)
        principal_inertia_csys.col(0) *= -1;

    SetDensity((float)density);
    SetMass(mass * density);
    // this->SetInertia(inertia * density);
    SetInertiaXX(ChVector<>(principal_I) * density);

    // Set the COG coordinates to barycenter, without displacing the REF reference
    SetFrame_COG_to_REF(ChFrame<>(baricenter, principal_inertia_csys));

    if (collide) {
        assert(material);
        // avoid passing to collision the inner points discarded by convex hull
        // processor, so use mesh vertexes instead of all argument points
        std::vector<ChVector<>> points_reduced;
        points_reduced.resize(vshape->GetMesh()->getCoordsVertices().size());
        for (unsigned int i = 0; i < vshape->GetMesh()->getCoordsVertices().size(); ++i)
            points_reduced[i] = vshape->GetMesh()->getCoordsVertices()[i];

        GetCollisionModel()->ClearModel();
        GetCollisionModel()->AddConvexHull(material, points_reduced);
        GetCollisionModel()->BuildModel();
        SetCollide(true);
    }

    m_mesh = vshape->GetMesh();
}